

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,Assignment *a)

{
  uint uVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  char (*args) [2];
  Type local_90;
  Type local_78;
  CompileMessage local_50;
  Assignment *local_18;
  Assignment *a_local;
  PostResolutionChecks *this_local;
  
  local_18 = a;
  a_local = (Assignment *)this;
  ASTVisitor::visit(&this->super_ASTVisitor,a);
  pEVar2 = pool_ref<soul::AST::Expression>::operator->(&local_18->target);
  uVar1 = (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[0xf])();
  if ((uVar1 & 1) == 0) {
    pEVar2 = &local_18->super_Expression;
    Errors::operatorNeedsAssignableTarget<char_const(&)[2]>(&local_50,(Errors *)0x4aecb7,args);
    AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_50,false);
  }
  pEVar2 = &local_18->super_Expression;
  pEVar3 = pool_ref<soul::AST::Expression>::operator->(&local_18->target);
  (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[4])();
  Type::withConstAndRefFlags(&local_78,&local_90,false,false);
  pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)&local_18->newValue);
  expectSilentCastPossible(&(pEVar2->super_Statement).super_ASTObject.context,&local_78,pEVar3);
  Type::~Type(&local_78);
  Type::~Type(&local_90);
  return;
}

Assistant:

void visit (AST::Assignment& a) override
        {
            super::visit (a);

            if (! a.target->isAssignable())
                a.context.throwError (Errors::operatorNeedsAssignableTarget ("="));

            expectSilentCastPossible (a.context,
                                      a.target->getResultType().withConstAndRefFlags (false, false),
                                      a.newValue);
        }